

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-list.c
# Opt level: O0

void test_qlist_iterate(void)

{
  int iVar1;
  QDATA *pQVar2;
  QLIST_NODE *pQVar3;
  QLIST_NODE *pQVar4;
  int n;
  QDATA *data;
  QLIST_NODE *node;
  QLIST list;
  undefined8 in_stack_ffffffffffffffd0;
  int local_24;
  QLIST_NODE *local_18;
  QLIST local_10;
  
  iVar1 = (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  qlist_init(&local_10);
  pQVar2 = alloc_qdata(iVar1);
  qlist_append(&local_10,&pQVar2->list_node);
  pQVar2 = alloc_qdata(iVar1);
  qlist_append(&local_10,&pQVar2->list_node);
  pQVar2 = alloc_qdata(iVar1);
  qlist_append(&local_10,&pQVar2->list_node);
  local_18 = qlist_head(&local_10);
  local_24 = 1;
  while( true ) {
    pQVar4 = local_18;
    pQVar3 = qlist_end(&local_10);
    if (pQVar4 == pQVar3) break;
    acutest_check_((int)(ulong)(*(int *)&local_18[-1].n == local_24),
                   "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                   ,0x136,"%s","data->value == n");
    local_18 = qlist_next(local_18);
    local_24 = local_24 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar1 = qlist_is_empty(&local_10);
    if (iVar1 != 0) break;
    pQVar4 = qlist_head(&local_10);
    qlist_remove_head((QLIST *)0x105545);
    free(pQVar4 + -1);
    local_24 = local_24 + 1;
  }
  acutest_check_((int)(ulong)(local_24 == 3),
                 "/workspace/llm4binary/github/license_c_cmakelists/mity[P]c-reusables/tests/test-list.c"
                 ,0x141,"%s","n == 3");
  return;
}

Assistant:

static void
test_qlist_iterate(void)
{
    QLIST list;
    QLIST_NODE* node;
    QDATA* data;
    int n;

    /* Create simple list. */
    qlist_init(&list);
    qlist_append(&list, &alloc_qdata(1)->list_node);
    qlist_append(&list, &alloc_qdata(2)->list_node);
    qlist_append(&list, &alloc_qdata(3)->list_node);

    /* Iterate forward. */
    for(node = qlist_head(&list), n = 1; node != qlist_end(&list); node = qlist_next(node), n++) {
        data = QLIST_DATA(node, QDATA, list_node);
        TEST_CHECK(data->value == n);
    }

    /* Clean up. */
    n = 0;
    while(!qlist_is_empty(&list)) {
        node = qlist_head(&list);
        qlist_remove_head(&list);
        free(QLIST_DATA(node, QDATA, list_node));
        n++;
    }
    TEST_CHECK(n == 3);
}